

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void mg_sock_get_addr(sock_t sock,int remote,socket_address *sa)

{
  socklen_t local_1c;
  socket_address *psStack_18;
  socklen_t slen;
  socket_address *sa_local;
  int remote_local;
  sock_t sock_local;
  
  local_1c = 8;
  psStack_18 = sa;
  sa_local._0_4_ = remote;
  sa_local._4_4_ = sock;
  memset(sa,0,0x10);
  if ((int)sa_local == 0) {
    getsockname(sa_local._4_4_,(sockaddr *)&psStack_18->sa,&local_1c);
  }
  else {
    getpeername(sa_local._4_4_,(sockaddr *)&psStack_18->sa,&local_1c);
  }
  return;
}

Assistant:

static void mg_sock_get_addr(sock_t sock, int remote,
                             union socket_address *sa) {
#ifndef MG_CC3200
    socklen_t slen = sizeof(sa);
    memset(sa, 0, sizeof(*sa));
    if (remote) {
        getpeername(sock, &sa->sa, &slen);
    } else {
        getsockname(sock, &sa->sa, &slen);
    }
#else
    memset(sa, 0, sizeof(*sa));
#endif
}